

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

void __thiscall
CLI::Option_group::Option_group
          (Option_group *this,string *group_description,string *group_name,App *parent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Option *pOVar3;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  local_c8._M_dataplus._M_p = (group_description->_M_dataplus)._M_p;
  paVar1 = &group_description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar1) {
    local_c8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_c8.field_2._8_8_ = *(undefined8 *)((long)&group_description->field_2 + 8);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_c8._M_string_length = group_description->_M_string_length;
  (group_description->_M_dataplus)._M_p = (pointer)paVar1;
  group_description->_M_string_length = 0;
  (group_description->field_2)._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  App::App(&this->super_App,&local_c8,&local_48,parent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  (this->super_App)._vptr_App = (_func_int **)&PTR__App_0013ed48;
  pcVar2 = (group_name->_M_dataplus)._M_p;
  local_68[0] = local_58;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + group_name->_M_string_length);
  ::std::__cxx11::string::_M_assign((string *)&(this->super_App).group_);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if ((group_name->_M_string_length == 0) || (*(group_name->_M_dataplus)._M_p == '+')) {
    local_88 = local_78;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
    paVar1 = &local_e8.field_2;
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    pOVar3 = (this->super_App).help_ptr_;
    if (pOVar3 != (Option *)0x0) {
      App::remove_option(&this->super_App,pOVar3);
      (this->super_App).help_ptr_ = (Option *)0x0;
    }
    if (local_80 != 0) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_88,local_88 + local_80)
      ;
      pOVar3 = App::
               add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                         (&this->super_App,&local_108,&local_e8);
      (this->super_App).help_ptr_ = pOVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
        pOVar3 = (this->super_App).help_ptr_;
      }
      (pOVar3->super_OptionBase<CLI::Option>).configurable_ = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    local_a8 = local_98;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    pOVar3 = (this->super_App).help_all_ptr_;
    if (pOVar3 != (Option *)0x0) {
      App::remove_option(&this->super_App,pOVar3);
      (this->super_App).help_all_ptr_ = (Option *)0x0;
    }
    if (local_a0 != 0) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_a8,local_a8 + local_a0)
      ;
      pOVar3 = App::
               add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                         (&this->super_App,&local_108,&local_e8);
      (this->super_App).help_all_ptr_ = pOVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
        pOVar3 = (this->super_App).help_all_ptr_;
      }
      (pOVar3->super_OptionBase<CLI::Option>).configurable_ = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8);
    }
  }
  return;
}

Assistant:

Option_group(std::string group_description, std::string group_name, App *parent)
        : App(std::move(group_description), "", parent) {
        group(group_name);
        // option groups should have automatic fallthrough
        if(group_name.empty() || group_name.front() == '+') {
            // help will not be used by default in these contexts
            set_help_flag("");
            set_help_all_flag("");
        }
    }